

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

int cpu_breakpoint_insert_x86_64(CPUState *cpu,vaddr pc,int flags,CPUBreakpoint **breakpoint)

{
  CPUBreakpoint *pCVar1;
  CPUBreakpoint *pCVar2;
  CPUBreakpoint *bp;
  CPUBreakpoint **breakpoint_local;
  int flags_local;
  vaddr pc_local;
  CPUState *cpu_local;
  
  pCVar2 = (CPUBreakpoint *)g_malloc(0x20);
  pCVar2->pc = pc;
  pCVar2->flags = flags;
  if ((flags & 0x10U) == 0) {
    (pCVar2->entry).tqe_next = (CPUBreakpoint *)0x0;
    (pCVar2->entry).tqe_circ.tql_prev = (cpu->breakpoints).tqh_circ.tql_prev;
    ((cpu->breakpoints).tqh_circ.tql_prev)->tql_next = pCVar2;
    (cpu->breakpoints).tqh_circ.tql_prev = (QTailQLink *)&pCVar2->entry;
  }
  else {
    pCVar1 = (cpu->breakpoints).tqh_first;
    (pCVar2->entry).tqe_next = pCVar1;
    if (pCVar1 == (CPUBreakpoint *)0x0) {
      (cpu->breakpoints).tqh_circ.tql_prev = (QTailQLink *)&pCVar2->entry;
    }
    else {
      (((cpu->breakpoints).tqh_first)->entry).tqe_circ.tql_prev = (QTailQLink *)&pCVar2->entry;
    }
    (cpu->breakpoints).tqh_first = pCVar2;
    (pCVar2->entry).tqe_circ.tql_prev = (QTailQLink *)&cpu->breakpoints;
  }
  breakpoint_invalidate(cpu,pc);
  if (breakpoint != (CPUBreakpoint **)0x0) {
    *breakpoint = pCVar2;
  }
  return 0;
}

Assistant:

int cpu_breakpoint_insert(CPUState *cpu, vaddr pc, int flags,
                          CPUBreakpoint **breakpoint)
{
    CPUBreakpoint *bp;

    bp = g_malloc(sizeof(*bp));

    bp->pc = pc;
    bp->flags = flags;

    /* keep all GDB-injected breakpoints in front */
    if (flags & BP_GDB) {
        QTAILQ_INSERT_HEAD(&cpu->breakpoints, bp, entry);
    } else {
        QTAILQ_INSERT_TAIL(&cpu->breakpoints, bp, entry);
    }

    breakpoint_invalidate(cpu, pc);

    if (breakpoint) {
        *breakpoint = bp;
    }
    return 0;
}